

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void rhash_sha512_final(sha512_ctx *ctx,uchar *result)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar1 = (uint)ctx->length;
  uVar4 = uVar1 >> 3 & 0xf;
  uVar2 = (ulong)uVar4;
  bVar3 = (byte)(uVar1 << 3);
  ctx->message[uVar2] = 0x80L << (bVar3 & 0x3f) ^ ~(-1L << (bVar3 & 0x3f)) & ctx->message[uVar2];
  uVar2 = uVar2 + 1;
  if (0xd < uVar4) {
    if ((int)uVar2 == 0xf) {
      ctx->message[0xf] = 0;
    }
    rhash_sha512_process_block(ctx->hash,ctx->message);
    uVar2 = 0;
  }
  for (; uVar2 < 0xf; uVar2 = uVar2 + 1) {
    ctx->message[uVar2] = 0;
  }
  uVar2 = ctx->length << 3;
  ctx->message[0xf] =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | ctx->length << 0x3b;
  rhash_sha512_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u64(result,0,ctx->hash,(ulong)ctx->digest_length);
    return;
  }
  return;
}

Assistant:

void rhash_sha512_final(sha512_ctx* ctx, unsigned char* result)
{
	size_t index = ((unsigned)ctx->length & 127) >> 3;
	unsigned shift = ((unsigned)ctx->length & 7) * 8;

	/* pad message and process the last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= le2me_64( ~(I64(0xFFFFFFFFFFFFFFFF) << shift) );
	ctx->message[index++] ^= le2me_64( I64(0x80) << shift );

	/* if no room left in the message to store 128-bit message length */
	if (index >= 15) {
		if (index == 15) ctx->message[index] = 0;
		rhash_sha512_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 15) {
		ctx->message[index++] = 0;
	}
	ctx->message[15] = be2me_64(ctx->length << 3);
	rhash_sha512_process_block(ctx->hash, ctx->message);

	if (result) be64_copy(result, 0, ctx->hash, ctx->digest_length);
}